

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_parameters.cpp
# Opt level: O3

array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL> * __thiscall
polyscope::CameraParameters::generateCameraRayCorners
          (array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL> *__return_storage_ptr__,
          CameraParameters *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  int iVar6;
  long lVar7;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *paVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined8 uVar12;
  undefined1 auVar13 [56];
  undefined1 auVar11 [64];
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [16];
  vec3 vVar17;
  vec<3,_float,_(glm::qualifier)0> vVar18;
  vec3 screenPos3;
  mat4x4 viewMat;
  mat<4,_4,_float,_(glm::qualifier)0> Result;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_100;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_fc;
  float local_f8;
  undefined4 local_f4;
  array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL> *local_f0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *local_e8;
  long local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  vec<4,_float,_(glm::qualifier)0> local_c8;
  mat<4,_4,_float,_(glm::qualifier)0> local_b8;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_70;
  undefined8 local_6c;
  undefined8 uStack_64;
  ulong uStack_5c;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_b8.value[0].field_0 = (this->extrinsics).E.value[0].field_0;
  local_b8.value[0].field_1 = (this->extrinsics).E.value[0].field_1;
  local_b8.value[0].field_2 = (this->extrinsics).E.value[0].field_2;
  local_b8.value[0].field_3 = (this->extrinsics).E.value[0].field_3;
  local_b8.value[1].field_0 = (this->extrinsics).E.value[1].field_0;
  local_b8.value[1].field_1 = (this->extrinsics).E.value[1].field_1;
  local_b8.value[1].field_2 = (this->extrinsics).E.value[1].field_2;
  local_b8.value[1].field_3 = (this->extrinsics).E.value[1].field_3;
  local_b8.value[2].field_0 = (this->extrinsics).E.value[2].field_0;
  local_b8.value[2].field_1 = (this->extrinsics).E.value[2].field_1;
  local_b8.value[2].field_2 = (this->extrinsics).E.value[2].field_2;
  local_b8.value[2].field_3 = (this->extrinsics).E.value[2].field_3;
  local_b8.value[3].field_0 = (this->extrinsics).E.value[3].field_0;
  local_b8.value[3].field_1 = (this->extrinsics).E.value[3].field_1;
  local_b8.value[3].field_2 = (this->extrinsics).E.value[3].field_2;
  local_b8.value[3].field_3 = (this->extrinsics).E.value[3].field_3;
  fVar1 = (this->intrinsics).aspectRatioWidthOverHeight;
  fVar9 = tanf((this->intrinsics).fovVerticalDegrees * 0.017453292 * 0.5);
  fVar1 = fVar9 * fVar1;
  local_6c = 0;
  uStack_64 = 0;
  uStack_54 = 0;
  uStack_50 = 0;
  uStack_4c = 0;
  uStack_40 = 0;
  local_70.x = 2.0 / (fVar1 + fVar1);
  auVar14._8_4_ = 0xbf800000;
  auVar14._0_8_ = 0xbf800000bf800000;
  auVar14._12_4_ = 0xbf800000;
  uStack_5c = (ulong)(uint)(2.0 / (fVar9 + fVar9));
  uVar12 = 0x3f8000003f800000;
  local_c8.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  local_c8.field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  local_c8.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x3f800000;
  local_c8.field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3f800000;
  local_48 = vmovlps_avx(auVar14);
  local_38 = 0xc0000000;
  vVar17 = CameraExtrinsics::getPosition(&this->extrinsics);
  local_e8 = &__return_storage_ptr__->_M_elems[0].field_2;
  local_e0 = 0;
  iVar6 = 0;
  local_f0 = __return_storage_ptr__;
  uStack_d0 = uVar12;
  do {
    lVar7 = 0;
    paVar8 = local_e8 + local_e0 * 3;
    do {
      local_100 = vVar17.field_2;
      local_d8 = vVar17._0_8_;
      local_fc.x = (float)(int)lVar7;
      auVar13 = (undefined1  [56])0x0;
      local_f4 = 0;
      local_f8 = 1.0 - (float)iVar6;
      vVar18 = glm::unProjectNO<float,float,(glm::qualifier)0>
                         ((vec<3,_float,_(glm::qualifier)0> *)&local_fc,&local_b8,
                          (mat<4,_4,_float,_(glm::qualifier)0> *)&local_70,&local_c8);
      vVar17.field_2.z = local_100.z;
      vVar17.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_d8;
      vVar17.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_d8._4_4_;
      auVar11._0_8_ = vVar18._0_8_;
      auVar11._8_56_ = auVar13;
      auVar5._8_8_ = uStack_d0;
      auVar5._0_8_ = local_d8;
      lVar7 = lVar7 + 1;
      auVar14 = vsubps_avx(auVar11._0_16_,auVar5);
      fVar4 = vVar18.field_2.z - local_100.z;
      fVar1 = auVar14._0_4_;
      auVar16._0_4_ = fVar1 * fVar1;
      fVar9 = auVar14._4_4_;
      auVar16._4_4_ = fVar9 * fVar9;
      fVar2 = auVar14._8_4_;
      auVar16._8_4_ = fVar2 * fVar2;
      fVar3 = auVar14._12_4_;
      auVar16._12_4_ = fVar3 * fVar3;
      auVar14 = vhaddps_avx(auVar16,auVar16);
      auVar14 = ZEXT416((uint)(fVar4 * fVar4 + auVar14._0_4_));
      auVar14 = vsqrtss_avx(auVar14,auVar14);
      fVar15 = 1.0 / auVar14._0_4_;
      auVar10._0_4_ = fVar1 * fVar15;
      auVar10._4_4_ = fVar9 * fVar15;
      auVar10._8_4_ = fVar2 * fVar15;
      auVar10._12_4_ = fVar3 * fVar15;
      uVar12 = vmovlps_avx(auVar10);
      ((vec<3,_float,_(glm::qualifier)0> *)(paVar8 + -2))->field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar12;
      ((vec<3,_float,_(glm::qualifier)0> *)(paVar8 + -2))->field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar12 >> 0x20);
      paVar8->z = fVar4 * fVar15;
      paVar8 = paVar8 + 3;
    } while ((int)lVar7 != 2);
    iVar6 = iVar6 + 1;
    local_e0 = local_e0 + lVar7;
  } while (iVar6 != 2);
  return local_f0;
}

Assistant:

std::array<glm::vec3, 4> CameraParameters::generateCameraRayCorners() const {

  // prep values
  glm::mat4x4 viewMat = getViewMat();
  glm::mat4 projMat =
      glm::infinitePerspective(glm::radians(getFoVVerticalDegrees()), getAspectRatioWidthOverHeight(), 1.f);
  glm::vec4 viewport = {0., 0., 1., 1.};
  glm::vec3 rootPos = getPosition();

  std::array<glm::vec3, 4> outCorners;

  size_t i = 0;
  for (float iY = 0; iY <= 1.; iY++) {
    for (float iX = 0; iX <= 1.; iX++) {
      glm::vec3 screenPos3 = glm::vec3{iX, 1. - iY, 0.};
      glm::vec3 worldPos = glm::unProject(screenPos3, viewMat, projMat, viewport);
      glm::vec3 worldRayDir = glm::normalize(worldPos - rootPos);
      outCorners[i] = worldRayDir;
      i++;
    }
  }

  return outCorners;
}